

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsLoadSignalHandlerCallbackNoExit
               (_func_HelicsBool_int *handler,HelicsBool useSeparateThread)

{
  code *pcVar1;
  code *__handler;
  
  pcVar1 = anon_unknown.dwarf_18303::signalHandlerThreadedCallbackNoExit;
  if (useSeparateThread == 0) {
    pcVar1 = anon_unknown.dwarf_18303::signalHandlerCallbackNoExit;
  }
  __handler = anon_unknown.dwarf_18303::signalHandlerThreadedNoExit;
  if (useSeparateThread == 0) {
    __handler = anon_unknown.dwarf_18303::signalHandlerNoExit;
  }
  if (handler != (_func_HelicsBool_int *)0x0) {
    __handler = pcVar1;
  }
  (anonymous_namespace)::keyHandler = handler;
  signal(2,__handler);
  return;
}

Assistant:

void helicsLoadSignalHandlerCallbackNoExit(HelicsBool (*handler)(int), HelicsBool useSeparateThread)
{
    keyHandler = handler;
    if (handler != nullptr) {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedCallbackNoExit));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerCallbackNoExit));
        }

    } else {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedNoExit));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerNoExit));
        }
    }
}